

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getCanonicalTimeZoneID_63
                  (UChar *id,int32_t len,UChar *result,int32_t resultCapacity,UBool *isSystemID,
                  UErrorCode *status)

{
  undefined4 uVar1;
  UBool UVar2;
  Char16Ptr local_e8 [3];
  UnicodeString local_d0;
  UBool local_89;
  undefined1 local_88 [7];
  UBool systemID;
  UnicodeString canonical;
  int32_t reslen;
  UErrorCode *status_local;
  UBool *isSystemID_local;
  int32_t resultCapacity_local;
  UChar *result_local;
  int32_t len_local;
  UChar *id_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*status), UVar2 != '\0')) {
    return 0;
  }
  if (isSystemID != (UBool *)0x0) {
    *isSystemID = '\0';
  }
  if ((((id != (UChar *)0x0) && (len != 0)) && (result != (UChar *)0x0)) && (0 < resultCapacity)) {
    canonical.fUnion._52_4_ = 0;
    icu_63::UnicodeString::UnicodeString((UnicodeString *)local_88);
    local_89 = '\0';
    icu_63::UnicodeString::UnicodeString(&local_d0,id,len);
    icu_63::TimeZone::getCanonicalID(&local_d0,(UnicodeString *)local_88,&local_89,status);
    icu_63::UnicodeString::~UnicodeString(&local_d0);
    UVar2 = U_SUCCESS(*status);
    if (UVar2 != '\0') {
      if (isSystemID != (UBool *)0x0) {
        *isSystemID = local_89;
      }
      icu_63::Char16Ptr::Char16Ptr(local_e8,result);
      canonical.fUnion._52_4_ =
           icu_63::UnicodeString::extract((UnicodeString *)local_88,local_e8,resultCapacity,status);
      icu_63::Char16Ptr::~Char16Ptr(local_e8);
    }
    uVar1 = canonical.fUnion._52_4_;
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_88);
    return uVar1;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getCanonicalTimeZoneID(const UChar* id, int32_t len,
                            UChar* result, int32_t resultCapacity, UBool *isSystemID, UErrorCode* status) {
    if(status == 0 || U_FAILURE(*status)) {
        return 0;
    }
    if (isSystemID) {
        *isSystemID = FALSE;
    }
    if (id == 0 || len == 0 || result == 0 || resultCapacity <= 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t reslen = 0;
    UnicodeString canonical;
    UBool systemID = FALSE;
    TimeZone::getCanonicalID(UnicodeString(id, len), canonical, systemID, *status);
    if (U_SUCCESS(*status)) {
        if (isSystemID) {
            *isSystemID = systemID;
        }
        reslen = canonical.extract(result, resultCapacity, *status);
    }
    return reslen;
}